

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-player-properties.c
# Opt level: O0

void textui_interact_with_specialties(void)

{
  _Bool _Var1;
  undefined1 local_14 [8];
  ui_event answer;
  
  while( true ) {
    _Var1 = get_com_ex("View abilities or Learn specialty (l/v/ESC)?",(ui_event *)local_14);
    if (!_Var1) {
      return;
    }
    if ((local_14._4_4_ == 0x4c) || (local_14._4_4_ == 0x6c)) break;
    if ((local_14._4_4_ == 0x56) || (local_14._4_4_ == 0x76)) {
      view_abilities();
      return;
    }
    if (local_14._4_4_ == 0xe000) {
      return;
    }
  }
  gain_specialty();
  return;
}

Assistant:

void textui_interact_with_specialties(void)
{
	ui_event answer;

	/* Interact and choose. */
	while (get_com_ex
		   ("View abilities or Learn specialty (l/v/ESC)?", &answer)) {
		/* New ability */
		if ((answer.key.code == 'L') || (answer.key.code == 'l')) {
			gain_specialty();
			break;
		}

		/* View Current */
		if ((answer.key.code == 'V') || (answer.key.code == 'v')) {
			view_abilities();
			break;
		}

		/* Exit */
		if (answer.key.code == ESCAPE)
			break;
	}
}